

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O2

bool __thiscall cmFileInstaller::GetTargetTypeFromString(cmFileInstaller *this,string *stype)

{
  cmExecutionStatus *pcVar1;
  bool bVar2;
  ostream *poVar3;
  ostringstream e;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  bVar2 = std::operator==(stype,"EXECUTABLE");
  if (bVar2) {
    *(undefined4 *)&(this->super_cmFileCopier).field_0xf4 = 0;
  }
  else {
    bVar2 = std::operator==(stype,"FILE");
    if (bVar2) {
      *(undefined4 *)&(this->super_cmFileCopier).field_0xf4 = 4;
    }
    else {
      bVar2 = std::operator==(stype,"PROGRAM");
      if (bVar2) {
        *(undefined4 *)&(this->super_cmFileCopier).field_0xf4 = 5;
      }
      else {
        bVar2 = std::operator==(stype,"STATIC_LIBRARY");
        if (bVar2) {
          *(undefined4 *)&(this->super_cmFileCopier).field_0xf4 = 1;
        }
        else {
          bVar2 = std::operator==(stype,"SHARED_LIBRARY");
          if (bVar2) {
            *(undefined4 *)&(this->super_cmFileCopier).field_0xf4 = 2;
          }
          else {
            bVar2 = std::operator==(stype,"MODULE");
            if (bVar2) {
              *(undefined4 *)&(this->super_cmFileCopier).field_0xf4 = 3;
            }
            else {
              bVar2 = std::operator==(stype,"DIRECTORY");
              if (!bVar2) {
                std::__cxx11::ostringstream::ostringstream(local_190);
                poVar3 = std::operator<<((ostream *)local_190,"Option TYPE given unknown value \"");
                poVar3 = std::operator<<(poVar3,(string *)stype);
                std::operator<<(poVar3,"\".");
                pcVar1 = (this->super_cmFileCopier).Status;
                std::__cxx11::stringbuf::str();
                std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
                std::__cxx11::string::~string(local_1b0);
                std::__cxx11::ostringstream::~ostringstream(local_190);
                return false;
              }
              *(undefined4 *)&(this->super_cmFileCopier).field_0xf4 = 6;
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool cmFileInstaller::GetTargetTypeFromString(const std::string& stype)
{
  if (stype == "EXECUTABLE") {
    this->InstallType = cmInstallType_EXECUTABLE;
  } else if (stype == "FILE") {
    this->InstallType = cmInstallType_FILES;
  } else if (stype == "PROGRAM") {
    this->InstallType = cmInstallType_PROGRAMS;
  } else if (stype == "STATIC_LIBRARY") {
    this->InstallType = cmInstallType_STATIC_LIBRARY;
  } else if (stype == "SHARED_LIBRARY") {
    this->InstallType = cmInstallType_SHARED_LIBRARY;
  } else if (stype == "MODULE") {
    this->InstallType = cmInstallType_MODULE_LIBRARY;
  } else if (stype == "DIRECTORY") {
    this->InstallType = cmInstallType_DIRECTORY;
  } else {
    std::ostringstream e;
    e << "Option TYPE given unknown value \"" << stype << "\".";
    this->Status.SetError(e.str());
    return false;
  }
  return true;
}